

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

void __thiscall pstack::CacheReader::CacheReader(CacheReader *this,csptr *upstream_)

{
  csptr *upstream__local;
  CacheReader *this_local;
  
  Reader::Reader(&this->super_Reader);
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR__CacheReader_002f27a8;
  std::shared_ptr<const_pstack::Reader>::shared_ptr(&this->upstream,upstream_);
  std::
  unordered_map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&this->stringCache);
  std::__cxx11::
  list<std::unique_ptr<pstack::CacheReader::Page,_std::default_delete<pstack::CacheReader::Page>_>,_std::allocator<std::unique_ptr<pstack::CacheReader::Page,_std::default_delete<pstack::CacheReader::Page>_>_>_>
  ::list(&this->pages);
  return;
}

Assistant:

CacheReader::CacheReader(Reader::csptr upstream_)
    : upstream(std::move(upstream_))
{
}